

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O2

ssize_t __thiscall axl::io::ShmtWriter::write(ShmtWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t i;
  size_t sVar4;
  ShmtFileHdr *pSVar5;
  __sighandler_t __handler;
  ShmtMessageHdr *msgHdr;
  char *_pDst;
  undefined4 in_register_00000034;
  void **__stat_loc;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  uVar8 = 0;
  for (sVar4 = 0; __n != sVar4; sVar4 = sVar4 + 1) {
    uVar8 = uVar8 + *(long *)((long)__buf + sVar4 * 8);
  }
  if (uVar8 == 0) {
    return 0;
  }
  uVar7 = uVar8 + 0xf & 0xfffffffffffffff8;
  if (((this->super_ShmtBase).m_flags >> 0x10 & 1) == 0) {
    uVar7 = uVar8;
  }
  __stat_loc = (void **)CONCAT44(in_register_00000034,__fd);
  pthread_mutex_lock((pthread_mutex_t *)&this->m_writeLock);
  sys::atomicLock(&((this->super_ShmtBase).m_hdr)->m_lock);
  pSVar5 = (this->super_ShmtBase).m_hdr;
  if (((pSVar5->m_dataSize == 0) || (pSVar5->m_readOffset < pSVar5->m_writeOffset)) ||
     (pSVar5->m_writeOffset + uVar7 <= (ulong)pSVar5->m_readOffset)) {
LAB_001233c9:
    uVar1 = pSVar5->m_writeOffset;
    LOCK();
    if (pSVar5->m_lock == 1) {
      pSVar5->m_lock = 0;
    }
    UNLOCK();
    uVar7 = uVar7 + uVar1;
    bVar2 = ShmtBase::ensureOffsetMapped(&this->super_ShmtBase,uVar7);
    if (bVar2) {
      _pDst = (this->super_ShmtBase).m_data + uVar1;
      if (((this->super_ShmtBase).m_flags & 0x10000) != 0) {
        _pDst[0] = '\n';
        _pDst[1] = 'm';
        _pDst[2] = 's';
        _pDst[3] = ':';
        *(int *)(_pDst + 4) = (int)uVar8;
        _pDst = _pDst + 8;
      }
      copyWriteChain(_pDst,(void **)CONCAT44(in_register_00000034,__fd),(size_t *)__buf,__n);
      sys::atomicLock(&((this->super_ShmtBase).m_hdr)->m_lock);
      pSVar5 = (this->super_ShmtBase).m_hdr;
      uVar6 = (uint32_t)uVar7;
      if ((pSVar5->m_readOffset < pSVar5->m_writeOffset) || (pSVar5->m_dataSize == 0)) {
        uVar3 = 0;
        if (uVar7 <= this->m_sizeLimitHint) {
          uVar3 = uVar6;
        }
        pSVar5->m_writeOffset = uVar3;
        pSVar5->m_endOffset = uVar6;
      }
      else {
        pSVar5->m_writeOffset = uVar6;
      }
      pSVar5->m_dataSize = pSVar5->m_dataSize + (int)uVar8;
      if (pSVar5->m_writeSemaphoreWaitCount != 0) {
        sys::NamedSemaphore::signal
                  (&(this->super_ShmtBase).m_writeSemaphore,pSVar5->m_writeSemaphoreWaitCount,
                   __handler);
        pSVar5 = (this->super_ShmtBase).m_hdr;
        pSVar5->m_writeSemaphoreWaitCount = 0;
      }
      LOCK();
      if (pSVar5->m_lock == 1) {
        pSVar5->m_lock = 0;
      }
      UNLOCK();
      goto LAB_001234aa;
    }
  }
  else {
    while (((pSVar5 = (this->super_ShmtBase).m_hdr, pSVar5->m_dataSize != 0 &&
            (pSVar5->m_writeOffset <= pSVar5->m_readOffset)) &&
           (((ulong)pSVar5->m_readOffset < pSVar5->m_writeOffset + uVar7 &&
            ((pSVar5->m_state & 4) == 0))))) {
      pSVar5->m_readSemaphoreWaitCount = pSVar5->m_readSemaphoreWaitCount + 1;
      LOCK();
      if (pSVar5->m_lock == 1) {
        pSVar5->m_lock = 0;
      }
      UNLOCK();
      sys::psx::NamedSem::wait(&(this->super_ShmtBase).m_readSemaphore.m_sem,__stat_loc);
      sys::atomicLock(&((this->super_ShmtBase).m_hdr)->m_lock);
    }
    if ((pSVar5->m_state & 4) == 0) goto LAB_001233c9;
    LOCK();
    if (pSVar5->m_lock == 1) {
      pSVar5->m_lock = 0;
    }
    UNLOCK();
    err::ErrorRef::ErrorRef((ErrorRef *)&local_48,0x10);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_48);
  }
  uVar8 = 0xffffffffffffffff;
LAB_001234aa:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_writeLock);
  return uVar8;
}

Assistant:

size_t
ShmtWriter::write(
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	ASSERT(isOpen());

	bool result;

	size_t chainSize = 0;
	for (size_t i = 0; i < count; i++)
		chainSize += sizeArray[i];

	if (!chainSize)
		return 0;

	size_t writeSize = chainSize;

	if (m_flags & ShmtFlag_Message) {
		writeSize += sizeof(ShmtMessageHdr);
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		writeSize = sl::align<AXL_PTR_SIZE> (writeSize);
#endif
	}

	sys::ScopeLock scopeLock(&m_writeLock); // ensure atomic write

	sys::atomicLock(&m_hdr->m_lock);

	// if buffer is wrapped, then wait until we have enough space

	if (m_hdr->m_dataSize &&
		m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
		m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset) {
		while (
			m_hdr->m_dataSize &&
			m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
			m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset &&
			!(m_hdr->m_state & ShmtState_Disconnected)) {
			m_hdr->m_readSemaphoreWaitCount++;
			sys::atomicUnlock(&m_hdr->m_lock);

			m_readSemaphore.wait();

			sys::atomicLock(&m_hdr->m_lock);
		}

		if (m_hdr->m_state & ShmtState_Disconnected) {
			sys::atomicUnlock(&m_hdr->m_lock);
			err::setError(err::SystemErrorCode_InvalidDeviceState);
			return -1;
		}
	}

	size_t writeOffset = m_hdr->m_writeOffset;

	sys::atomicUnlock(&m_hdr->m_lock);

	size_t writeEndOffset = writeOffset + writeSize;

	result = ensureOffsetMapped(writeEndOffset);
	if (!result)
		return -1;

	if (m_flags & ShmtFlag_Message) {
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		ASSERT(sl::isAligned<AXL_PTR_SIZE> (writeOffset));
#endif

		ShmtMessageHdr* msgHdr = (ShmtMessageHdr*)(m_data + writeOffset);
		msgHdr->m_signature = ShmtConst_MessageSignature;
		msgHdr->m_size = chainSize;
		copyWriteChain(msgHdr + 1, blockArray, sizeArray, count);
	} else {
		copyWriteChain(m_data + writeOffset, blockArray, sizeArray, count);
	}

	sys::atomicLock(&m_hdr->m_lock);

	if (m_hdr->m_writeOffset <= m_hdr->m_readOffset && m_hdr->m_dataSize) { // wrapped
		m_hdr->m_writeOffset = writeEndOffset;
	} else {
		m_hdr->m_writeOffset = writeEndOffset > m_sizeLimitHint ? 0 : writeEndOffset;
		m_hdr->m_endOffset = writeEndOffset;
	}

	m_hdr->m_dataSize += chainSize;

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);

	return chainSize;
}